

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGeoCube.h
# Opt level: O0

void pzgeom::TPZGeoCube::GradX<double>
               (TPZFMatrix<double> *nodes,TPZVec<double> *loc,TPZFMatrix<double> *gradx)

{
  double dVar1;
  double *pdVar2;
  long *in_RDX;
  TPZBaseMatrix *in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double col;
  int j;
  int i;
  TPZFNMatrix<12,_double> dphi;
  TPZFNMatrix<4,_double> phi;
  int ncol;
  int nrow;
  double in_stack_fffffffffffffdc0;
  double in_stack_fffffffffffffdc8;
  TPZFNMatrix<12,_double> *in_stack_fffffffffffffdd0;
  int local_1e4;
  int local_1e0;
  TPZFMatrix<double> *in_stack_ffffffffffffff20;
  TPZFMatrix<double> *in_stack_ffffffffffffff28;
  TPZVec<double> *in_stack_ffffffffffffff30;
  
  (**(code **)(*in_RDX + 0x68))(in_RDX,3);
  (**(code **)(*in_RDX + 0x78))();
  TPZBaseMatrix::Rows(in_RDI);
  TPZBaseMatrix::Cols(in_RDI);
  TPZFNMatrix<4,_double>::TPZFNMatrix
            ((TPZFNMatrix<4,_double> *)in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
             (int64_t)in_stack_fffffffffffffdc0);
  TPZFNMatrix<12,_double>::TPZFNMatrix
            (in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
             (int64_t)in_stack_fffffffffffffdc0);
  pztopology::TPZCube::TShape<double>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  for (local_1e0 = 0; local_1e0 < 8; local_1e0 = local_1e0 + 1) {
    for (local_1e4 = 0; local_1e4 < 3; local_1e4 = local_1e4 + 1) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_1e4,(long)local_1e0);
      pdVar2 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffdd0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffdc8,(int64_t)in_stack_fffffffffffffdc0);
      dVar1 = *pdVar2;
      pdVar2 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffdd0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffdc8,(int64_t)in_stack_fffffffffffffdc0);
      *pdVar2 = extraout_XMM0_Qa * dVar1 + *pdVar2;
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_1e4,(long)local_1e0);
      pdVar2 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffdd0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffdc8,(int64_t)in_stack_fffffffffffffdc0);
      in_stack_fffffffffffffdc8 = *pdVar2;
      in_stack_fffffffffffffdd0 =
           (TPZFNMatrix<12,_double> *)
           TPZFMatrix<double>::operator()
                     (&in_stack_fffffffffffffdd0->super_TPZFMatrix<double>,
                      (int64_t)in_stack_fffffffffffffdc8,(int64_t)in_stack_fffffffffffffdc0);
      (in_stack_fffffffffffffdd0->super_TPZFMatrix<double>).super_TPZMatrix<double>.
      super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)
           (extraout_XMM0_Qa_00 * in_stack_fffffffffffffdc8 +
           (double)(in_stack_fffffffffffffdd0->super_TPZFMatrix<double>).super_TPZMatrix<double>.
                   super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_1e4,(long)local_1e0);
      in_stack_fffffffffffffdc0 = col;
      pdVar2 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffdd0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffdc8,(int64_t)col);
      dVar1 = *pdVar2;
      pdVar2 = TPZFMatrix<double>::operator()
                         (&in_stack_fffffffffffffdd0->super_TPZFMatrix<double>,
                          (int64_t)in_stack_fffffffffffffdc8,(int64_t)in_stack_fffffffffffffdc0);
      *pdVar2 = in_stack_fffffffffffffdc0 * dVar1 + *pdVar2;
    }
  }
  TPZFNMatrix<12,_double>::~TPZFNMatrix((TPZFNMatrix<12,_double> *)0x1623f34);
  TPZFNMatrix<4,_double>::~TPZFNMatrix((TPZFNMatrix<4,_double> *)0x1623f41);
  return;
}

Assistant:

inline void TPZGeoCube::GradX(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc, TPZFMatrix<T> &gradx){
        
        gradx.Resize(3,3);
        gradx.Zero();
        int nrow = nodes.Rows();
        int ncol = nodes.Cols();
#ifdef PZDEBUG
        if(nrow != 3 || ncol  != 8){
            std::cout << "Objects of incompatible lengths, gradient cannot be computed." << std::endl;
            std::cout << "nodes matrix must be 3x8." << std::endl;
            DebugStop();
        }
        
#endif
        TPZFNMatrix<4,T> phi(NNodes,1);
        TPZFNMatrix<12,T> dphi(3,NNodes);
        TShape(loc,phi,dphi);
        for(int i = 0; i < NNodes; i++)
        {
            for(int j = 0; j < 3; j++)
            {
                gradx(j,0) += nodes.GetVal(j,i)*dphi(0,i);
                gradx(j,1) += nodes.GetVal(j,i)*dphi(1,i);
                gradx(j,2) += nodes.GetVal(j,i)*dphi(2,i);
            }
        }
        
    }